

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssxmlExporter.cpp
# Opt level: O0

int Assimp::AssxmlExport::ioprintf(IOStream *io,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1108 [16];
  undefined8 local_10f8;
  undefined8 local_10f0;
  undefined8 local_10e8;
  undefined8 local_10e0;
  undefined8 local_10d8;
  undefined8 local_10c8;
  undefined8 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  uint local_104c;
  undefined4 local_1048;
  uint nSize;
  va_list va;
  char local_1028 [8];
  char sz [4096];
  char *format_local;
  IOStream *io_local;
  
  if (in_AL != '\0') {
    local_10d8 = in_XMM0_Qa;
    local_10c8 = in_XMM1_Qa;
    local_10b8 = in_XMM2_Qa;
    local_10a8 = in_XMM3_Qa;
    local_1098 = in_XMM4_Qa;
    local_1088 = in_XMM5_Qa;
    local_1078 = in_XMM6_Qa;
    local_1068 = in_XMM7_Qa;
  }
  if (io == (IOStream *)0x0) {
    io_local._4_4_ = 0xffffffff;
  }
  else {
    local_10f8 = in_RDX;
    local_10f0 = in_RCX;
    local_10e8 = in_R8;
    local_10e0 = in_R9;
    memset(local_1028,0,0x1000);
    va[0].overflow_arg_area = local_1108;
    va[0]._0_8_ = &stack0x00000008;
    nSize = 0x30;
    local_1048 = 0x10;
    local_104c = vsnprintf(local_1028,0xfff,format,&local_1048);
    if (0xfff < local_104c) {
      __assert_fail("nSize < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assxml/AssxmlExporter.cpp"
                    ,0x56,"int Assimp::AssxmlExport::ioprintf(IOStream *, const char *, ...)");
    }
    (*io->_vptr_IOStream[3])(io,local_1028,1,(ulong)local_104c);
    io_local._4_4_ = local_104c;
  }
  return io_local._4_4_;
}

Assistant:

static int ioprintf( IOStream * io, const char *format, ... ) {
	using namespace std;
    if ( nullptr == io ) {
        return -1;
    }

    static const int Size = 4096;
    char sz[ Size ];
    ::memset( sz, '\0', Size );
    va_list va;
    va_start( va, format );
    const unsigned int nSize = vsnprintf( sz, Size-1, format, va );
    ai_assert( nSize < Size );
    va_end( va );

    io->Write( sz, sizeof(char), nSize );

    return nSize;
}